

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  byte *pbVar1;
  u8 uVar2;
  int p1;
  Vdbe *p;
  WhereLoop *pWVar3;
  Index *pIVar4;
  sqlite3 *db;
  ExprList *pEVar5;
  ExprList *pList;
  Expr *pExpr;
  int iVar6;
  int iVar7;
  ulong uVar8;
  Expr *pX;
  ExprList *pList_00;
  InLoop *pIVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int p3;
  Expr *pEVar14;
  long lVar15;
  uint uVar16;
  int local_b4;
  int *local_b0;
  ExprList *local_a0;
  byte local_60;
  
  pEVar14 = pTerm->pExpr;
  uVar2 = pEVar14->op;
  if (uVar2 != '5') {
    p = pParse->pVdbe;
    if (uVar2 == '2') {
      sqlite3VdbeAddOp2(p,0x49,0,iTarget);
      goto LAB_00174cef;
    }
    if (uVar2 != '-') {
      pWVar3 = pLevel->pWLoop;
      if ((((pWVar3->wsFlags & 0x400) == 0) &&
          (pIVar4 = (pWVar3->u).btree.pIndex, pIVar4 != (Index *)0x0)) &&
         (pIVar4->aSortOrder[iEq] != '\0')) {
        bRev = (int)(bRev == 0);
      }
      lVar15 = (long)iEq;
      uVar8 = 0;
      uVar11 = 0;
      if (0 < iEq) {
        uVar11 = (ulong)(uint)iEq;
      }
      for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
        if ((pWVar3->aLTerm[uVar8] != (WhereTerm *)0x0) && (pWVar3->aLTerm[uVar8]->pExpr == pEVar14)
           ) goto LAB_00174cef;
      }
      uVar13 = 0;
      for (lVar12 = lVar15; lVar12 < (long)(ulong)pWVar3->nLTerm; lVar12 = lVar12 + 1) {
        uVar13 = uVar13 + (pWVar3->aLTerm[lVar12]->pExpr == pEVar14);
      }
      if (((pEVar14->flags & 0x800) == 0) || (((pEVar14->x).pSelect)->pEList->nExpr == 1)) {
        local_b0 = (int *)0x0;
        local_b4 = sqlite3FindInIndex(pParse,pEVar14,4,(int *)0x0,(int *)0x0);
      }
      else {
        db = pParse->db;
        local_b0 = (int *)0x0;
        pX = sqlite3ExprDup(db,pEVar14,0);
        local_b4 = 5;
        if (db->mallocFailed == '\0') {
          pEVar5 = ((pX->x).pSelect)->pEList;
          pList = (pX->pLeft->x).pList;
          pList_00 = (ExprList *)0x0;
          local_a0 = (ExprList *)0x0;
          for (lVar12 = lVar15; lVar12 < (long)(ulong)pWVar3->nLTerm; lVar12 = lVar12 + 1) {
            if (pWVar3->aLTerm[lVar12]->pExpr == pEVar14) {
              lVar10 = (long)pWVar3->aLTerm[lVar12]->iField;
              pExpr = pEVar5->a[lVar10 + -1].pExpr;
              if (pExpr != (Expr *)0x0) {
                local_a0 = sqlite3ExprListAppend(pParse,local_a0,pExpr);
                pEVar5->a[lVar10 + -1].pExpr = (Expr *)0x0;
                pList_00 = sqlite3ExprListAppend(pParse,pList_00,pList->a[lVar10 + -1].pExpr);
                pList->a[lVar10 + -1].pExpr = (Expr *)0x0;
              }
            }
          }
          sqlite3ExprListDelete(db,pEVar5);
          sqlite3ExprListDelete(db,pList);
          (pX->pLeft->x).pList = pList_00;
          ((pX->x).pSelect)->pEList = local_a0;
          if ((pList_00 != (ExprList *)0x0) && (pList_00->nExpr == 1)) {
            pEVar14 = pList_00->a[0].pExpr;
            pList_00->a[0].pExpr = (Expr *)0x0;
            sqlite3ExprDelete(db,pX->pLeft);
            pX->pLeft = pEVar14;
          }
          pEVar5 = ((pX->x).pSelect)->pOrderBy;
          if (pEVar5 != (ExprList *)0x0) {
            uVar11 = 0;
            uVar8 = (ulong)(uint)pEVar5->nExpr;
            if (pEVar5->nExpr < 1) {
              uVar8 = uVar11;
            }
            for (; uVar8 * 0x20 != uVar11; uVar11 = uVar11 + 0x20) {
              *(undefined2 *)((long)&pEVar5->a[0].u + uVar11) = 0;
            }
          }
          if (db->mallocFailed == '\0') {
            local_b0 = (int *)sqlite3DbMallocZero(pParse->db,(ulong)uVar13 << 2);
            local_b4 = sqlite3FindInIndex(pParse,pX,4,(int *)0x0,local_b0);
            pTerm->pExpr->iTable = pX->iTable;
          }
          else {
            local_b0 = (int *)0x0;
          }
        }
        sqlite3ExprDelete(db,pX);
        pEVar14 = pTerm->pExpr;
      }
      uVar16 = (uint)(bRev == 0);
      if (local_b4 != 4) {
        uVar16 = bRev;
      }
      p1 = pEVar14->iTable;
      sqlite3VdbeAddOp2(p,(uint)(uVar16 == 0) * 4 + 0x20,p1,0);
      pbVar1 = (byte *)((long)&pWVar3->wsFlags + 1);
      *pbVar1 = *pbVar1 | 8;
      iVar6 = (pLevel->u).in.nIn;
      if (iVar6 == 0) {
        iVar6 = sqlite3VdbeMakeLabel(p);
        pLevel->addrNxt = iVar6;
        iVar6 = (pLevel->u).in.nIn;
      }
      (pLevel->u).in.nIn = uVar13 + iVar6;
      pIVar9 = (InLoop *)
               sqlite3DbReallocOrFree
                         (pParse->db,(pLevel->u).in.aInLoop,(long)(int)(uVar13 + iVar6) * 0x14);
      (pLevel->u).in.aInLoop = pIVar9;
      if (pIVar9 == (InLoop *)0x0) {
        (pLevel->u).in.nIn = 0;
      }
      else {
        pIVar9 = pIVar9 + iVar6;
        local_60 = uVar16 == 0 | 4;
        lVar12 = 0;
        iVar6 = 0;
        p3 = iTarget;
        for (; lVar15 < (long)(ulong)pWVar3->nLTerm; lVar15 = lVar15 + 1) {
          if (pWVar3->aLTerm[lVar15]->pExpr == pEVar14) {
            if (local_b4 == 1) {
              iVar7 = sqlite3VdbeAddOp2(p,0x81,p1,p3);
            }
            else {
              if (local_b0 == (int *)0x0) {
                iVar7 = 0;
              }
              else {
                lVar10 = (long)iVar6;
                iVar6 = iVar6 + 1;
                iVar7 = local_b0[lVar10];
              }
              iVar7 = sqlite3VdbeAddOp3(p,0x5a,p1,iVar7,p3);
            }
            pIVar9->addrInTop = iVar7;
            sqlite3VdbeAddOp1(p,0x32,p3);
            if (lVar12 == 0) {
              pIVar9->iCur = p1;
              pIVar9->eEndLoopOp = local_60;
              if ((iEq < 1) || (uVar13 = pWVar3->wsFlags, (uVar13 >> 10 & 1) != 0)) {
                pIVar9->nPrefix = 0;
              }
              else {
                pIVar9->iBase = iTarget - iEq;
                pIVar9->nPrefix = iEq;
                pWVar3->wsFlags = uVar13 | 0x40000;
              }
            }
            else {
              pIVar9->eEndLoopOp = 0xab;
            }
            pIVar9 = pIVar9 + 1;
          }
          lVar12 = lVar12 + -1;
          p3 = p3 + 1;
        }
      }
      sqlite3DbFree(pParse->db,local_b0);
      goto LAB_00174cef;
    }
  }
  iTarget = sqlite3ExprCodeTarget(pParse,pEVar14->pRight,iTarget);
LAB_00174cef:
  disableTerm(pLevel,pTerm);
  return iTarget;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  Vdbe *v = pParse->pVdbe;
  int iReg;                  /* Register holding results */

  assert( pLevel->pWLoop->aLTerm[iEq]==pTerm );
  assert( iTarget>0 );
  if( pX->op==TK_EQ || pX->op==TK_IS ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(v, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    int eType = IN_INDEX_NOOP;
    int iTab;
    struct InLoop *pIn;
    WhereLoop *pLoop = pLevel->pWLoop;
    int i;
    int nEq = 0;
    int *aiMap = 0;

    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
      && pLoop->u.btree.pIndex!=0
      && pLoop->u.btree.pIndex->aSortOrder[iEq]
    ){
      testcase( iEq==0 );
      testcase( bRev );
      bRev = !bRev;
    }
    assert( pX->op==TK_IN );
    iReg = iTarget;

    for(i=0; i<iEq; i++){
      if( pLoop->aLTerm[i] && pLoop->aLTerm[i]->pExpr==pX ){
        disableTerm(pLevel, pTerm);
        return iTarget;
      }
    }
    for(i=iEq;i<pLoop->nLTerm; i++){
      assert( pLoop->aLTerm[i]!=0 );
      if( pLoop->aLTerm[i]->pExpr==pX ) nEq++;
    }

    if( (pX->flags & EP_xIsSelect)==0 || pX->x.pSelect->pEList->nExpr==1 ){
      eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, 0);
    }else{
      sqlite3 *db = pParse->db;
      pX = removeUnindexableInClauseTerms(pParse, iEq, pLoop, pX);

      if( !db->mallocFailed ){
        aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*nEq);
        eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap);
        pTerm->pExpr->iTable = pX->iTable;
      }
      sqlite3ExprDelete(db, pX);
      pX = pTerm->pExpr;
    }

    if( eType==IN_INDEX_INDEX_DESC ){
      testcase( bRev );
      bRev = !bRev;
    }
    iTab = pX->iTable;
    sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
    VdbeCoverageIf(v, bRev);
    VdbeCoverageIf(v, !bRev);
    assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );

    pLoop->wsFlags |= WHERE_IN_ABLE;
    if( pLevel->u.in.nIn==0 ){
      pLevel->addrNxt = sqlite3VdbeMakeLabel(v);
    }

    i = pLevel->u.in.nIn;
    pLevel->u.in.nIn += nEq;
    pLevel->u.in.aInLoop =
       sqlite3DbReallocOrFree(pParse->db, pLevel->u.in.aInLoop,
                              sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
    pIn = pLevel->u.in.aInLoop;
    if( pIn ){
      int iMap = 0;               /* Index in aiMap[] */
      pIn += i;
      for(i=iEq;i<pLoop->nLTerm; i++){
        if( pLoop->aLTerm[i]->pExpr==pX ){
          int iOut = iReg + i - iEq;
          if( eType==IN_INDEX_ROWID ){
            testcase( nEq>1 );  /* Happens with a UNIQUE index on ROWID */
            pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iOut);
          }else{
            int iCol = aiMap ? aiMap[iMap++] : 0;
            pIn->addrInTop = sqlite3VdbeAddOp3(v,OP_Column,iTab, iCol, iOut);
          }
          sqlite3VdbeAddOp1(v, OP_IsNull, iOut); VdbeCoverage(v);
          if( i==iEq ){
            pIn->iCur = iTab;
            pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
            if( iEq>0 && (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0 ){
              pIn->iBase = iReg - i;
              pIn->nPrefix = i;
              pLoop->wsFlags |= WHERE_IN_EARLYOUT;
            }else{
              pIn->nPrefix = 0;
            }
          }else{
            pIn->eEndLoopOp = OP_Noop;
          }
          pIn++;
        }
      }
    }else{
      pLevel->u.in.nIn = 0;
    }
    sqlite3DbFree(pParse->db, aiMap);
#endif
  }
  disableTerm(pLevel, pTerm);
  return iReg;
}